

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_tags.cpp
# Opt level: O2

int __thiscall FTagManager::GetFirstLineID(FTagManager *this,line_t_conflict *line)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  
  uVar2 = (uint)(((long)line - (long)lines) / 0x98);
  iVar1 = 0;
  if (((-1 < (int)uVar2) && (iVar1 = 0, (int)uVar2 < (int)(this->startForLine).Count)) &&
     (lVar3 = (long)(this->startForLine).Array[uVar2 & 0x7fffffff], -1 < lVar3)) {
    iVar1 = (this->allIDs).Array[lVar3].tag;
  }
  return iVar1;
}

Assistant:

int FTagManager::GetFirstLineID(const line_t *line) const
{
	int i = lineindex(line);
	return LineHasIDs(i) ? allIDs[startForLine[i]].tag : 0;
}